

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWriteCex(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Ntk_t *pNtk_00;
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  Abc_Cex_t *pAVar4;
  Abc_Obj_t *pObj_00;
  char *pcVar5;
  char *pcVar6;
  char *cycle_ctr;
  int i_1;
  FILE *pFile_1;
  Abc_Obj_t *pObj;
  int i;
  FILE *pFile;
  Abc_Cex_t *pCex;
  int fVerbose;
  int fUseFfNames;
  int fPrintFull;
  int fAiger;
  int forceSeq;
  int fCheckCex;
  int fUseOldMin;
  int fHighEffort;
  int fUseSatBased;
  int fMinimize;
  int fNames;
  int c;
  char *pFileName;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fUseSatBased = 0;
  fHighEffort = 0;
  fUseOldMin = 0;
  fCheckCex = 0;
  forceSeq = 0;
  fAiger = 0;
  bVar1 = false;
  fUseFfNames = 0;
  fVerbose = 0;
  pCex._4_4_ = 0;
  pCex._0_4_ = 0;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"snmueocafzvh"), iVar2 != -1) {
    switch(iVar2) {
    case 0x61:
      fUseFfNames = fUseFfNames ^ 1;
      break;
    default:
      goto LAB_0039f7df;
    case 99:
      fAiger = fAiger ^ 1;
      break;
    case 0x65:
      fCheckCex = fCheckCex ^ 1;
      break;
    case 0x66:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x68:
      goto LAB_0039f7df;
    case 0x6d:
      fHighEffort = fHighEffort ^ 1;
      break;
    case 0x6e:
      fUseSatBased = fUseSatBased ^ 1;
      break;
    case 0x6f:
      forceSeq = forceSeq ^ 1;
      break;
    case 0x73:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x75:
      fUseOldMin = fUseOldMin ^ 1;
      break;
    case 0x76:
      pCex._0_4_ = (uint)pCex ^ 1;
      break;
    case 0x7a:
      pCex._4_4_ = pCex._4_4_ ^ 1;
    }
  }
  pNtk_00 = pAbc->pNtkCur;
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    fprintf((FILE *)pAbc->Out,"Empty network.\n");
    pAbc_local._4_4_ = 0;
  }
  else if (((pNtk_00->pModel == (int *)0x0) && (pAbc->pCex == (Abc_Cex_t *)0x0)) &&
          (pAbc->vCexVec == (Vec_Ptr_t *)0x0)) {
    fprintf((FILE *)pAbc->Out,"Counter-example is not available.\n");
    pAbc_local._4_4_ = 0;
  }
  else if (argc == globalUtilOptind + 1) {
    pcVar6 = argv[globalUtilOptind];
    if ((pAbc->pCex == (Abc_Cex_t *)0x0) && (pAbc->vCexVec == (Vec_Ptr_t *)0x0)) {
      pFVar3 = fopen(pcVar6,"w");
      if (pFVar3 == (FILE *)0x0) {
        fprintf(_stdout,"IoCommandWriteCex(): Cannot open the output file \"%s\".\n",pcVar6);
        return 1;
      }
      if (fUseSatBased == 0) {
        for (cycle_ctr._4_4_ = 0; iVar2 = Abc_NtkPiNum(pNtk_00), cycle_ctr._4_4_ < iVar2;
            cycle_ctr._4_4_ = cycle_ctr._4_4_ + 1) {
          Abc_NtkPi(pNtk_00,cycle_ctr._4_4_);
          fprintf(pFVar3,"%c",(ulong)((pNtk_00->pModel[cycle_ctr._4_4_] == 1) + 0x30));
        }
      }
      else {
        pcVar6 = "";
        if (bVar1) {
          pcVar6 = "@0";
        }
        for (cycle_ctr._4_4_ = 0; iVar2 = Abc_NtkPiNum(pNtk_00), cycle_ctr._4_4_ < iVar2;
            cycle_ctr._4_4_ = cycle_ctr._4_4_ + 1) {
          pObj_00 = Abc_NtkPi(pNtk_00,cycle_ctr._4_4_);
          pcVar5 = Abc_ObjName(pObj_00);
          fprintf(pFVar3,"%s%s=%c\n",pcVar5,pcVar6,
                  (ulong)((pNtk_00->pModel[cycle_ctr._4_4_] == 1) + 0x30));
        }
      }
      fprintf(pFVar3,"\n");
      fclose(pFVar3);
    }
    else {
      pAVar4 = pAbc->pCex;
      pFVar3 = fopen(pcVar6,"w");
      if (pFVar3 == (FILE *)0x0) {
        fprintf(_stdout,"IoCommandWriteCex(): Cannot open the output file \"%s\".\n",pcVar6);
        return 1;
      }
      if (pAbc->pCex == (Abc_Cex_t *)0x0) {
        if (pAbc->vCexVec != (Vec_Ptr_t *)0x0) {
          for (pObj._4_4_ = 0; iVar2 = Vec_PtrSize(pAbc->vCexVec), (int)pObj._4_4_ < iVar2;
              pObj._4_4_ = pObj._4_4_ + 1) {
            pAVar4 = (Abc_Cex_t *)Vec_PtrEntry(pAbc->vCexVec,pObj._4_4_);
            if (pAVar4 != (Abc_Cex_t *)0x0) {
              fprintf(pFVar3,"#\n#\n# CEX for output %d\n#\n",(ulong)pObj._4_4_);
              Abc_NtkDumpOneCex((FILE *)pFVar3,pNtk_00,pAVar4,fVerbose,fUseSatBased,pCex._4_4_,
                                fHighEffort,forceSeq,fAiger,fUseOldMin,fCheckCex,fUseFfNames,
                                (uint)pCex);
            }
          }
        }
      }
      else {
        Abc_NtkDumpOneCex((FILE *)pFVar3,pNtk_00,pAVar4,fVerbose,fUseSatBased,pCex._4_4_,fHighEffort
                          ,forceSeq,fAiger,fUseOldMin,fCheckCex,fUseFfNames,(uint)pCex);
      }
      fprintf(pFVar3,"# DONE\n");
      fclose(pFVar3);
    }
    pAbc_local._4_4_ = 0;
  }
  else {
    printf("File name is missing on the command line.\n");
LAB_0039f7df:
    fprintf((FILE *)pAbc->Err,"usage: write_cex [-snmueocfzvh] <file>\n");
    fprintf((FILE *)pAbc->Err,
            "\t         saves counter-example (CEX) derived by \"sat\", \"iprove\", \"dprove\", etc\n"
           );
    fprintf((FILE *)pAbc->Err,
            "\t         the output file <file> contains values for each PI in natural order\n");
    pcVar6 = "no";
    if (bVar1) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-s     : always report a sequential CEX (cycle 0 for comb) [default = %s]\n",pcVar6);
    pcVar6 = "no";
    if (fUseSatBased != 0) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-n     : write input names into the file [default = %s]\n",pcVar6);
    pcVar6 = "no";
    if (fHighEffort != 0) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-m     : minimize CEX by dropping don\'t-care values [default = %s]\n",pcVar6);
    pcVar6 = "no";
    if (fUseOldMin != 0) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-u     : use fast SAT-based CEX minimization [default = %s]\n",
            pcVar6);
    pcVar6 = "no";
    if (fCheckCex != 0) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-e     : use high-effort SAT-based CEX minimization [default = %s]\n",pcVar6);
    pcVar6 = "no";
    if (forceSeq != 0) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-o     : use old CEX minimization algorithm [default = %s]\n",
            pcVar6);
    pcVar6 = "no";
    if (fAiger != 0) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-c     : check generated CEX using ternary simulation [default = %s]\n",pcVar6);
    pcVar6 = "no";
    if (fUseFfNames != 0) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-a     : print cex in AIGER 1.9 format [default = %s]\n",pcVar6);
    pcVar6 = "no";
    if (fVerbose != 0) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-f     : enable printing flop values in each timeframe [default = %s]\n",pcVar6);
    pcVar6 = "no";
    if (pCex._4_4_ != 0) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-z     : toggle using saved flop names [default = %s]\n",pcVar6);
    pcVar6 = "no";
    if ((uint)pCex != 0) {
      pcVar6 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-v     : enable verbose output [default = %s]\n",pcVar6);
    fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
    fprintf((FILE *)pAbc->Err,"\t<file> : the name of the file to write\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandWriteCex( Abc_Frame_t * pAbc, int argc, char **argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int c, fNames  = 0;
    int fMinimize  = 0;
    int fUseSatBased = 0;
    int fHighEffort = 0;
    int fUseOldMin = 0;
    int fCheckCex  = 0;
    int forceSeq   = 0;
    int fAiger     = 0;
    int fPrintFull = 0;
    int fUseFfNames = 0;
    int fVerbose   = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "snmueocafzvh" ) ) != EOF )
    {
        switch ( c )
        {
            case 's':
                forceSeq ^= 1;
                break;
            case 'n':
                fNames ^= 1;
                break;
            case 'm':
                fMinimize ^= 1;
                break;
            case 'u':
                fUseSatBased ^= 1;
                break;
            case 'e':
                fHighEffort ^= 1;
                break;
            case 'o':
                fUseOldMin ^= 1;
                break;
            case 'c':
                fCheckCex ^= 1;
                break;
            case 'a':
                fAiger ^= 1;
                break;
            case 'f':
                fPrintFull ^= 1;
                break;
            case 'z':
                fUseFfNames ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    pNtk = pAbc->pNtkCur;
    if ( pNtk == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( pNtk->pModel == NULL && pAbc->pCex == NULL && pAbc->vCexVec == NULL )
    {
        fprintf( pAbc->Out, "Counter-example is not available.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
    {
        printf( "File name is missing on the command line.\n" );
        goto usage;
    }

    // get the input file name
    pFileName = argv[globalUtilOptind];
    // write the counter-example into the file
    if ( pAbc->pCex || pAbc->vCexVec )
    { 
        Abc_Cex_t * pCex = pAbc->pCex;
        FILE * pFile; int i;
        /*
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( !Abc_LatchIsInit0(pObj) )
            {
                fprintf( stdout, "IoCommandWriteCex(): The init-state should be all-0 for counter-example to work.\n" );
                fprintf( stdout, "Run commands \"undc\" and \"zero\" and then rerun the equivalence check.\n" );
                return 1;
            }
        */
        pFile = fopen( pFileName, "w" );
        if ( pFile == NULL )
        {
            fprintf( stdout, "IoCommandWriteCex(): Cannot open the output file \"%s\".\n", pFileName );
            return 1;
        }
        if ( pAbc->pCex )
        {
            Abc_NtkDumpOneCex( pFile, pNtk, pCex, 
                fPrintFull, fNames, fUseFfNames, fMinimize, fUseOldMin, 
                fCheckCex, fUseSatBased, fHighEffort, fAiger, fVerbose );
        }
        else if ( pAbc->vCexVec )
        {
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pCex, i )
            {
                if ( pCex == NULL )
                    continue;
                fprintf( pFile, "#\n#\n# CEX for output %d\n#\n", i ); 
                Abc_NtkDumpOneCex( pFile, pNtk, pCex, 
                    fPrintFull, fNames, fUseFfNames, fMinimize, fUseOldMin, 
                    fCheckCex, fUseSatBased, fHighEffort, fAiger, fVerbose );
            }
        }
        fprintf( pFile, "# DONE\n" ); 
        fclose( pFile );
    }
    else
    {
        Abc_Obj_t * pObj;
        FILE * pFile = fopen( pFileName, "w" );
        int i;
        if ( pFile == NULL )
        {
            fprintf( stdout, "IoCommandWriteCex(): Cannot open the output file \"%s\".\n", pFileName );
            return 1;
        }
        if ( fNames )
        {
            const char *cycle_ctr = forceSeq?"@0":"";
            Abc_NtkForEachPi( pNtk, pObj, i )
//                fprintf( pFile, "%s=%c\n", Abc_ObjName(pObj), '0'+(pNtk->pModel[i]==1) );
                fprintf( pFile, "%s%s=%c\n", Abc_ObjName(pObj), cycle_ctr, '0'+(pNtk->pModel[i]==1) );
        }
        else
        {
            Abc_NtkForEachPi( pNtk, pObj, i )
                fprintf( pFile, "%c", '0'+(pNtk->pModel[i]==1) );
        }
        fprintf( pFile, "\n" );
        fclose( pFile );
    }

    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_cex [-snmueocfzvh] <file>\n" );
    fprintf( pAbc->Err, "\t         saves counter-example (CEX) derived by \"sat\", \"iprove\", \"dprove\", etc\n" );
    fprintf( pAbc->Err, "\t         the output file <file> contains values for each PI in natural order\n" );
    fprintf( pAbc->Err, "\t-s     : always report a sequential CEX (cycle 0 for comb) [default = %s]\n", forceSeq? "yes": "no" );
    fprintf( pAbc->Err, "\t-n     : write input names into the file [default = %s]\n", fNames? "yes": "no" );
    fprintf( pAbc->Err, "\t-m     : minimize CEX by dropping don't-care values [default = %s]\n", fMinimize? "yes": "no" );
    fprintf( pAbc->Err, "\t-u     : use fast SAT-based CEX minimization [default = %s]\n", fUseSatBased? "yes": "no" );
    fprintf( pAbc->Err, "\t-e     : use high-effort SAT-based CEX minimization [default = %s]\n", fHighEffort? "yes": "no" );
    fprintf( pAbc->Err, "\t-o     : use old CEX minimization algorithm [default = %s]\n", fUseOldMin? "yes": "no" );
    fprintf( pAbc->Err, "\t-c     : check generated CEX using ternary simulation [default = %s]\n", fCheckCex? "yes": "no" );
    fprintf( pAbc->Err, "\t-a     : print cex in AIGER 1.9 format [default = %s]\n", fAiger? "yes": "no" );
    fprintf( pAbc->Err, "\t-f     : enable printing flop values in each timeframe [default = %s]\n", fPrintFull? "yes": "no" );  
    fprintf( pAbc->Err, "\t-z     : toggle using saved flop names [default = %s]\n", fUseFfNames? "yes": "no" );  
    fprintf( pAbc->Err, "\t-v     : enable verbose output [default = %s]\n", fVerbose? "yes": "no" );  
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\t<file> : the name of the file to write\n" );
    return 1;
}